

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccolumn_bmod.c
# Opt level: O0

int ccolumn_bmod(int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  flops_t *pfVar7;
  singlecomplex sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int_t iVar12;
  singlecomplex *Mxvec;
  int local_1a4;
  int local_1a0;
  int local_19c;
  float ci_9;
  float cr_9;
  float ci_8;
  float cr_8;
  float ci_7;
  float cr_7;
  float ci_6;
  float cr_6;
  float ci_5;
  float cr_5;
  float ci_4;
  float cr_4;
  float ci_3;
  float cr_3;
  float ci_2;
  float cr_2;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  flops_t *ops;
  int_t mem_error;
  singlecomplex comp_temp1;
  singlecomplex comp_temp;
  singlecomplex none;
  singlecomplex one;
  singlecomplex zero;
  singlecomplex *tempv1;
  int_t *piStack_100;
  int_t nzlumax;
  int_t *xlusup;
  singlecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int d_fsupc;
  int fst_col;
  int_t nextlu;
  int_t ufirst;
  int_t new_next;
  int_t no_zeros;
  int_t i;
  int_t irow;
  int_t isub;
  int_t kfnz;
  int_t lptr;
  int ksupno;
  int krep_ind;
  int krep;
  int ksub;
  int k;
  int jsupno;
  int jcolp1;
  int nrow;
  int segsze;
  int nsupr;
  int nsupc;
  int fsupc;
  int_t luptr2;
  int_t luptr1;
  int_t luptr;
  singlecomplex ukj2;
  singlecomplex ukj1;
  singlecomplex ukj;
  singlecomplex beta;
  singlecomplex alpha;
  int incy;
  int incx;
  int *repfnz_local;
  int *segrep_local;
  singlecomplex *tempv_local;
  singlecomplex *dense_local;
  int nseg_local;
  int jcol_local;
  
  memset(&one,0,8);
  pfVar7 = stat->ops;
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  lusup = (singlecomplex *)Glu->xlsub;
  xlusup = (int_t *)Glu->lusup;
  piStack_100 = Glu->xlusup;
  tempv1._4_4_ = Glu->nzlumax;
  k = jcol + 1;
  ksub = lsub[jcol];
  krep = nseg + -1;
  for (krep_ind = 0; krep_ind < nseg; krep_ind = krep_ind + 1) {
    ksupno = segrep[krep];
    krep = krep + -1;
    kfnz = lsub[ksupno];
    if (ksub != kfnz) {
      nsupr = supno[kfnz];
      local_19c = nsupr;
      if (nsupr <= fpanelc) {
        local_19c = fpanelc;
      }
      xsup._4_4_ = local_19c;
      xsup._0_4_ = local_19c - nsupr;
      iVar9 = piStack_100[local_19c] + (int)xsup;
      isub = (int)(&lusup->r)[nsupr] + (int)xsup;
      local_1a0 = repfnz[ksupno];
      if (local_1a0 <= fpanelc) {
        local_1a0 = fpanelc;
      }
      irow = local_1a0;
      jcolp1 = (ksupno - local_1a0) + 1;
      iVar10 = ksupno - local_19c;
      segsze = iVar10 + 1;
      nrow = (int)(&lusup->r)[nsupr + 1] - (int)(&lusup->r)[nsupr];
      jsupno = (nrow - (int)xsup) - segsze;
      iVar11 = isub + segsze;
      lptr = iVar11 + -1;
      if (jcolp1 == 1) {
        sVar8 = dense[xlsub[lptr]];
        luptr2 = nrow * iVar10 + segsze + iVar9;
        for (new_next = isub + segsze; new_next < (int)(&lusup->r)[nsupr + 1];
            new_next = new_next + 1) {
          no_zeros = xlsub[new_next];
          ukj1.r = sVar8.r;
          ukj1.i = sVar8.i;
          fVar1 = (float)xlusup[(long)luptr2 * 2];
          fVar2 = (float)xlusup[(long)luptr2 * 2 + 1];
          dense[no_zeros].r =
               dense[no_zeros].r -
               (ukj1.r * (float)xlusup[(long)luptr2 * 2] +
               -(ukj1.i * (float)xlusup[(long)luptr2 * 2 + 1]));
          dense[no_zeros].i = dense[no_zeros].i - (ukj1.i * fVar1 + ukj1.r * fVar2);
          luptr2 = luptr2 + 1;
        }
      }
      else if (jcolp1 < 4) {
        luptr2 = nrow * iVar10 + segsze + -1 + iVar9;
        ukj2 = dense[xlsub[iVar11 + -2]];
        fsupc = luptr2 - nrow;
        ukj1.r = dense[xlsub[lptr]].r;
        ukj1.i = dense[xlsub[lptr]].i;
        if (jcolp1 == 2) {
          ukj1.r = ukj1.r - (ukj2.r * (float)xlusup[(long)fsupc * 2] +
                            -(ukj2.i * (float)xlusup[(long)fsupc * 2 + 1]));
          ukj1.i = ukj1.i - (ukj2.i * (float)xlusup[(long)fsupc * 2] +
                            ukj2.r * (float)xlusup[(long)fsupc * 2 + 1]);
          dense[xlsub[lptr]] = ukj1;
          for (new_next = isub + segsze; new_next < (int)(&lusup->r)[nsupr + 1];
              new_next = new_next + 1) {
            no_zeros = xlsub[new_next];
            luptr2 = luptr2 + 1;
            fsupc = fsupc + 1;
            fVar1 = (float)xlusup[(long)luptr2 * 2];
            fVar2 = (float)xlusup[(long)luptr2 * 2 + 1];
            fVar3 = (float)xlusup[(long)fsupc * 2];
            fVar4 = (float)xlusup[(long)fsupc * 2 + 1];
            dense[no_zeros].r =
                 dense[no_zeros].r -
                 (ukj1.r * (float)xlusup[(long)luptr2 * 2] +
                  -(ukj1.i * (float)xlusup[(long)luptr2 * 2 + 1]) +
                 ukj2.r * (float)xlusup[(long)fsupc * 2] +
                 -(ukj2.i * (float)xlusup[(long)fsupc * 2 + 1]));
            dense[no_zeros].i =
                 dense[no_zeros].i -
                 (ukj1.i * fVar1 + ukj1.r * fVar2 + ukj2.i * fVar3 + ukj2.r * fVar4);
          }
        }
        else {
          _luptr1 = dense[xlsub[iVar11 + -3]];
          nsupc = fsupc - nrow;
          ukj2.r = ukj2.r - ((float)luptr1 * (float)xlusup[(long)(nsupc + -1) * 2] +
                            -((float)luptr * (float)xlusup[(long)(nsupc + -1) * 2 + 1]));
          ukj2.i = ukj2.i - ((float)luptr * (float)xlusup[(long)(nsupc + -1) * 2] +
                            (float)luptr1 * (float)xlusup[(long)(nsupc + -1) * 2 + 1]);
          ukj1.r = ukj1.r - (ukj2.r * (float)xlusup[(long)fsupc * 2] +
                             -(ukj2.i * (float)xlusup[(long)fsupc * 2 + 1]) +
                            (float)luptr1 * (float)xlusup[(long)nsupc * 2] +
                            -((float)luptr * (float)xlusup[(long)nsupc * 2 + 1]));
          ukj1.i = ukj1.i - (ukj2.i * (float)xlusup[(long)fsupc * 2] +
                             ukj2.r * (float)xlusup[(long)fsupc * 2 + 1] +
                            (float)luptr * (float)xlusup[(long)nsupc * 2] +
                            (float)luptr1 * (float)xlusup[(long)nsupc * 2 + 1]);
          dense[xlsub[lptr]] = ukj1;
          dense[xlsub[iVar11 + -2]] = ukj2;
          for (new_next = isub + segsze; new_next < (int)(&lusup->r)[nsupr + 1];
              new_next = new_next + 1) {
            no_zeros = xlsub[new_next];
            luptr2 = luptr2 + 1;
            fsupc = fsupc + 1;
            nsupc = nsupc + 1;
            fVar1 = (float)xlusup[(long)luptr2 * 2];
            fVar2 = (float)xlusup[(long)luptr2 * 2 + 1];
            fVar3 = (float)xlusup[(long)fsupc * 2];
            fVar4 = (float)xlusup[(long)fsupc * 2 + 1];
            fVar5 = (float)xlusup[(long)nsupc * 2];
            fVar6 = (float)xlusup[(long)nsupc * 2 + 1];
            dense[no_zeros].r =
                 dense[no_zeros].r -
                 (ukj1.r * (float)xlusup[(long)luptr2 * 2] +
                  -(ukj1.i * (float)xlusup[(long)luptr2 * 2 + 1]) +
                  ukj2.r * (float)xlusup[(long)fsupc * 2] +
                  -(ukj2.i * (float)xlusup[(long)fsupc * 2 + 1]) +
                 (float)luptr1 * (float)xlusup[(long)nsupc * 2] +
                 -((float)luptr * (float)xlusup[(long)nsupc * 2 + 1]));
            dense[no_zeros].i =
                 dense[no_zeros].i -
                 (ukj1.i * fVar1 + ukj1.r * fVar2 + ukj2.i * fVar3 + ukj2.r * fVar4 +
                 (float)luptr * fVar5 + (float)luptr1 * fVar6);
          }
        }
      }
      else {
        ufirst = local_1a0 - local_19c;
        i = isub + ufirst;
        for (new_next = 0; new_next < jcolp1; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          tempv[new_next] = dense[no_zeros];
          i = i + 1;
        }
        luptr2 = nrow * ufirst + ufirst + iVar9;
        clsolve(nrow,jcolp1,(singlecomplex *)(xlusup + (long)luptr2 * 2),tempv);
        luptr2 = jcolp1 + luptr2;
        Mxvec = tempv + jcolp1;
        cmatvec(nrow,jsupno,jcolp1,(singlecomplex *)(xlusup + (long)luptr2 * 2),tempv,Mxvec);
        i = isub + ufirst;
        for (new_next = 0; new_next < jcolp1; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          dense[no_zeros] = tempv[new_next];
          tempv[new_next] = one;
          i = i + 1;
        }
        for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          dense[no_zeros].r = dense[no_zeros].r - Mxvec[new_next].r;
          dense[no_zeros].i = dense[no_zeros].i - Mxvec[new_next].i;
          Mxvec[new_next] = one;
          i = i + 1;
        }
      }
    }
  }
  d_fsupc = piStack_100[jcol];
  nsupr = supno[ksub];
  nextlu = (d_fsupc + (int)(&lusup->r)[nsupr + 1]) - (int)(&lusup->r)[nsupr];
  while( true ) {
    if (nextlu <= tempv1._4_4_) {
      for (i = (int_t)(&lusup->r)[nsupr]; i < (int)(&lusup->r)[nsupr + 1]; i = i + 1) {
        no_zeros = xlsub[i];
        *(singlecomplex *)(xlusup + (long)d_fsupc * 2) = dense[no_zeros];
        dense[no_zeros] = one;
        d_fsupc = d_fsupc + 1;
      }
      piStack_100[k] = d_fsupc;
      if (fpanelc < nsupr) {
        local_1a4 = nsupr;
      }
      else {
        local_1a4 = fpanelc;
      }
      xsup._4_4_ = local_1a4;
      if (local_1a4 < jcol) {
        xsup._0_4_ = local_1a4 - nsupr;
        isub = (int)(&lusup->r)[nsupr] + (int)xsup;
        luptr2 = piStack_100[local_1a4] + (int)xsup;
        nrow = (int)(&lusup->r)[nsupr + 1] - (int)(&lusup->r)[nsupr];
        segsze = jcol - local_1a4;
        jsupno = (nrow - (int)xsup) - segsze;
        fst_col = piStack_100[jcol] + (int)xsup;
        pfVar7[0x13] = (float)(segsze * 4 * (segsze + -1)) + pfVar7[0x13];
        pfVar7[0x14] = (float)(jsupno * 8 * segsze) + pfVar7[0x14];
        clsolve(nrow,segsze,(singlecomplex *)(xlusup + (long)luptr2 * 2),
                (singlecomplex *)(xlusup + (long)fst_col * 2));
        cmatvec(nrow,jsupno,segsze,(singlecomplex *)(xlusup + (long)(luptr2 + segsze) * 2),
                (singlecomplex *)(xlusup + (long)fst_col * 2),tempv);
        i = fst_col + segsze;
        for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
          xlusup[(long)i * 2] = (int_t)((float)xlusup[(long)i * 2] - tempv[new_next].r);
          xlusup[(long)i * 2 + 1] = (int_t)((float)xlusup[(long)i * 2 + 1] - tempv[new_next].i);
          tempv[new_next] = one;
          i = i + 1;
        }
      }
      return 0;
    }
    iVar12 = cLUMemXpand(jcol,d_fsupc,LUSUP,(int_t *)((long)&tempv1 + 4),Glu);
    if (iVar12 != 0) break;
    xlusup = (int_t *)Glu->lusup;
    xlsub = Glu->lsub;
  }
  return iVar12;
}

Assistant:

int
ccolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     singlecomplex     *dense,	  /* in */
	     singlecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    singlecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    singlecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    singlecomplex       *tempv1;
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      none = {-1.0, 0.0};
    singlecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;




	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		    c_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    c_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    c_sub(&ukj1, &ukj1, &comp_temp);

		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    c_add(&comp_temp, &comp_temp, &comp_temp1);
		    c_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		clsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		cmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    c_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (singlecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}